

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# SpvBuilder.cpp
# Opt level: O2

Id __thiscall spv::Builder::makeStructResultType(Builder *this,Id type0,Id type1)

{
  Instruction *this_00;
  int iVar1;
  Id IVar2;
  mapped_type *pmVar3;
  long lVar4;
  Id type1_local;
  Id type0_local;
  Builder *local_50;
  vector<unsigned_int,_std::allocator<unsigned_int>_> members;
  
  lVar4 = 0;
  type1_local = type1;
  type0_local = type0;
  local_50 = this;
  while( true ) {
    members.super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl.
    super__Vector_impl_data._M_start =
         (pointer)CONCAT44(members.super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>.
                           _M_impl.super__Vector_impl_data._M_start._4_4_,0x1e);
    pmVar3 = std::__detail::
             _Map_base<unsigned_int,_std::pair<const_unsigned_int,_std::vector<spv::Instruction_*,_std::allocator<spv::Instruction_*>_>_>,_std::allocator<std::pair<const_unsigned_int,_std::vector<spv::Instruction_*,_std::allocator<spv::Instruction_*>_>_>_>,_std::__detail::_Select1st,_std::equal_to<unsigned_int>,_std::hash<unsigned_int>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<false,_false,_true>,_true>
             ::operator[]((_Map_base<unsigned_int,_std::pair<const_unsigned_int,_std::vector<spv::Instruction_*,_std::allocator<spv::Instruction_*>_>_>,_std::allocator<std::pair<const_unsigned_int,_std::vector<spv::Instruction_*,_std::allocator<spv::Instruction_*>_>_>_>,_std::__detail::_Select1st,_std::equal_to<unsigned_int>,_std::hash<unsigned_int>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<false,_false,_true>,_true>
                           *)&this->groupedTypes,(key_type *)&members);
    if ((int)((ulong)((long)(pmVar3->
                            super__Vector_base<spv::Instruction_*,_std::allocator<spv::Instruction_*>_>
                            )._M_impl.super__Vector_impl_data._M_finish -
                     (long)(pmVar3->
                           super__Vector_base<spv::Instruction_*,_std::allocator<spv::Instruction_*>_>
                           )._M_impl.super__Vector_impl_data._M_start) >> 3) <= lVar4) {
      members.super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl.
      super__Vector_impl_data._M_start = (pointer)0x0;
      members.super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl.
      super__Vector_impl_data._M_finish = (pointer)0x0;
      members.super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl.
      super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
      std::vector<unsigned_int,_std::allocator<unsigned_int>_>::push_back
                ((vector<unsigned_int,_std::allocator<unsigned_int>_> *)
                 &members.super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>,
                 &type0_local);
      std::vector<unsigned_int,_std::allocator<unsigned_int>_>::push_back
                ((vector<unsigned_int,_std::allocator<unsigned_int>_> *)
                 &members.super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>,
                 &type1_local);
      IVar2 = makeStructType(local_50,(vector<unsigned_int,_std::allocator<unsigned_int>_> *)
                                      &members.
                                       super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>
                             ,"ResType",true);
      std::_Vector_base<unsigned_int,_std::allocator<unsigned_int>_>::~_Vector_base
                (&members.super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>);
      return IVar2;
    }
    members.super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl.
    super__Vector_impl_data._M_start =
         (pointer)CONCAT44(members.super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>.
                           _M_impl.super__Vector_impl_data._M_start._4_4_,0x1e);
    pmVar3 = std::__detail::
             _Map_base<unsigned_int,_std::pair<const_unsigned_int,_std::vector<spv::Instruction_*,_std::allocator<spv::Instruction_*>_>_>,_std::allocator<std::pair<const_unsigned_int,_std::vector<spv::Instruction_*,_std::allocator<spv::Instruction_*>_>_>_>,_std::__detail::_Select1st,_std::equal_to<unsigned_int>,_std::hash<unsigned_int>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<false,_false,_true>,_true>
             ::operator[]((_Map_base<unsigned_int,_std::pair<const_unsigned_int,_std::vector<spv::Instruction_*,_std::allocator<spv::Instruction_*>_>_>,_std::allocator<std::pair<const_unsigned_int,_std::vector<spv::Instruction_*,_std::allocator<spv::Instruction_*>_>_>_>,_std::__detail::_Select1st,_std::equal_to<unsigned_int>,_std::hash<unsigned_int>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<false,_false,_true>,_true>
                           *)&this->groupedTypes,(key_type *)&members);
    this_00 = (pmVar3->super__Vector_base<spv::Instruction_*,_std::allocator<spv::Instruction_*>_>).
              _M_impl.super__Vector_impl_data._M_start[lVar4];
    iVar1 = Instruction::getNumOperands(this_00);
    if (((iVar1 == 2) && (IVar2 = Instruction::getIdOperand(this_00,0), IVar2 == type0)) &&
       (IVar2 = Instruction::getIdOperand(this_00,1), IVar2 == type1)) break;
    lVar4 = lVar4 + 1;
  }
  return this_00->resultId;
}

Assistant:

Id Builder::makeStructResultType(Id type0, Id type1)
{
    // try to find it
    Instruction* type;
    for (int t = 0; t < (int)groupedTypes[OpTypeStruct].size(); ++t) {
        type = groupedTypes[OpTypeStruct][t];
        if (type->getNumOperands() != 2)
            continue;
        if (type->getIdOperand(0) != type0 ||
            type->getIdOperand(1) != type1)
            continue;
        return type->getResultId();
    }

    // not found, make it
    std::vector<spv::Id> members;
    members.push_back(type0);
    members.push_back(type1);

    return makeStructType(members, "ResType");
}